

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scrfd_crowdhuman.cpp
# Opt level: O2

int main(int argc,char **argv)

{
  undefined4 uVar1;
  undefined4 uVar2;
  ulong uVar3;
  undefined4 uVar7;
  ulong uVar4;
  undefined4 uVar8;
  undefined8 uVar5;
  undefined8 uVar6;
  char *pcVar9;
  int *piVar10;
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  char cVar13;
  int iVar14;
  int iVar15;
  pointer pFVar16;
  ulong uVar17;
  float *pfVar18;
  ulong uVar19;
  ulong uVar20;
  long lVar21;
  int iVar22;
  float fVar23;
  float fVar24;
  int top;
  __m128 t_2;
  undefined1 auVar25 [16];
  float fVar27;
  undefined1 auVar26 [16];
  __m128 t;
  undefined1 auVar28 [16];
  undefined1 auVar29 [16];
  undefined1 auVar30 [16];
  undefined1 auVar31 [16];
  undefined1 local_488 [64];
  size_t local_448;
  vector<FaceObject,_std::allocator<FaceObject>_> faceobjects32;
  Extractor ex;
  undefined1 local_408 [32];
  Allocator *local_3e8;
  int iStack_3e0;
  int iStack_3dc;
  undefined1 auStack_3d8 [12];
  size_t local_3c8;
  vector<FaceObject,_std::allocator<FaceObject>_> faceproposals;
  vector<float,_std::allocator<float>_> areas;
  undefined1 local_348 [32];
  Allocator *local_328;
  int iStack_320;
  int iStack_31c;
  undefined1 auStack_318 [12];
  size_t local_308;
  Size label_size;
  int *local_2f8;
  Allocator *local_2e0;
  undefined1 local_2a8 [8];
  float fStack_2a0;
  float fStack_29c;
  vector<FaceObject,_std::allocator<FaceObject>_> faceobjects;
  undefined1 local_278 [64];
  size_t local_238;
  float local_228;
  float fStack_224;
  float fStack_220;
  float fStack_21c;
  Mat image;
  undefined4 local_210;
  int iStack_20c;
  Allocator *local_1f8;
  float norm_vals [3];
  float mean_vals [3];
  Mat m;
  undefined8 local_190;
  uchar *local_188;
  Net scrfd;
  
  if (argc == 2) {
    pcVar9 = argv[1];
    std::__cxx11::string::string((string *)&scrfd,pcVar9,(allocator *)&image);
    cv::imread((string *)&m,(int)&scrfd);
    std::__cxx11::string::~string((string *)&scrfd);
    cVar13 = cv::Mat::empty();
    if (cVar13 == '\0') {
      faceobjects.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      faceobjects.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      faceobjects.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      ncnn::Net::Net(&scrfd);
      scrfd.opt.use_vulkan_compute = true;
      iVar14 = ncnn::Net::load_param(&scrfd,"scrfd_crowdhuman.param");
      if ((iVar14 != 0) ||
         (iVar14 = ncnn::Net::load_model(&scrfd,"scrfd_crowdhuman.bin"), iVar14 != 0)) {
        exit(-1);
      }
      local_228 = (float)local_190;
      fStack_224 = (float)((ulong)local_190 >> 0x20);
      fStack_220 = 0.0;
      fStack_21c = 0.0;
      if ((int)local_228 < (int)fStack_224) {
        local_2a8._4_4_ = 640.0 / (float)(int)fStack_224;
        iVar15 = (int)((float)(int)local_228 * (float)local_2a8._4_4_);
        iVar14 = 0x280;
      }
      else {
        local_2a8._4_4_ = 640.0 / (float)(int)local_228;
        iVar14 = (int)((float)(int)fStack_224 * (float)local_2a8._4_4_);
        iVar15 = 0x280;
      }
      ncnn::Mat::from_pixels_resize
                ((Mat *)&image,local_188,0x10002,(int)fStack_224,(int)local_228,iVar14,iVar15,
                 (Allocator *)0x0);
      local_238 = 0;
      local_278._0_4_ = 0;
      local_278._4_4_ = 0;
      local_278._8_4_ = 0;
      local_278._12_4_ = 0;
      local_278._16_4_ = 0;
      local_278._20_4_ = 0;
      local_278._24_4_ = 0;
      local_278._32_8_ = (Allocator *)0x0;
      local_278._40_4_ = 0;
      local_278._44_4_ = 0;
      local_278._48_12_ = SUB1612((undefined1  [16])0x0,4);
      ncnn::Option::Option((Option *)&areas);
      iVar14 = ((iVar14 + 0x1f) / 0x20) * 0x20 - iVar14;
      iVar15 = ((iVar15 + 0x1f) / 0x20) * 0x20 - iVar15;
      iVar22 = iVar14 / 2;
      top = iVar15 / 2;
      ncnn::copy_make_border
                ((Mat *)&image,(Mat *)local_278,top,iVar15 - top,iVar22,iVar14 - iVar22,0,0.0,
                 (Option *)&areas);
      mean_vals[0] = 127.5;
      mean_vals[1] = 127.5;
      mean_vals[2] = 127.5;
      norm_vals[0] = 0.0078125;
      norm_vals[1] = 0.0078125;
      norm_vals[2] = 0.0078125;
      ncnn::Mat::substract_mean_normalize((Mat *)local_278,mean_vals,norm_vals);
      ncnn::Net::create_extractor((Net *)&ex);
      ncnn::Extractor::input(&ex,"input.1",(Mat *)local_278);
      faceproposals.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      faceproposals.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      faceproposals.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish._0_4_ = 0;
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish._4_4_ = 0;
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      local_448 = 0;
      local_488._0_4_ = 0;
      local_488._4_4_ = 0;
      local_488._8_4_ = 0;
      local_488._12_4_ = 0;
      local_488._16_8_ = (pointer)0x0;
      local_488._24_4_ = 0;
      local_488._32_8_ = (Allocator *)0x0;
      local_488._40_4_ = 0;
      local_488._44_4_ = 0;
      local_488._48_12_ = SUB1612((undefined1  [16])0x0,4);
      ncnn::Extractor::extract(&ex,"490",(Mat *)&areas,0);
      ncnn::Extractor::extract(&ex,"493",(Mat *)local_488,0);
      local_3c8 = 0;
      local_408._0_4_ = 0;
      local_408._4_4_ = 0;
      local_408._8_4_ = 0;
      local_408._12_4_ = 0;
      local_408._16_12_ = SUB1612((undefined1  [16])0x0,4);
      local_3e8 = (Allocator *)0x0;
      iStack_3e0 = 0;
      iStack_3dc = 0;
      auStack_3d8 = SUB1612((undefined1  [16])0x0,4);
      ncnn::Mat::create((Mat *)local_408,1,4,(Allocator *)0x0);
      *(undefined4 *)CONCAT44(local_408._4_4_,local_408._0_4_) = 0x40000000;
      local_308 = 0;
      local_348._0_4_ = 0;
      local_348._4_4_ = 0;
      local_348._8_4_ = 0;
      local_348._12_4_ = 0;
      local_348._16_12_ = SUB1612((undefined1  [16])0x0,4);
      local_328 = (Allocator *)0x0;
      iStack_320 = 0;
      iStack_31c = 0;
      auStack_318 = SUB1612((undefined1  [16])0x0,4);
      ncnn::Mat::create((Mat *)local_348,1,4,(Allocator *)0x0);
      *(undefined4 *)CONCAT44(local_348._4_4_,local_348._0_4_) = 0x40400000;
      generate_anchors((Mat *)&label_size,8,(Mat *)local_408,(Mat *)local_348);
      faceobjects32.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      faceobjects32.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      faceobjects32.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      generate_proposals((Mat *)&label_size,8,(Mat *)&areas,(Mat *)local_488,0.0,&faceobjects32);
      std::vector<FaceObject,std::allocator<FaceObject>>::
      insert<__gnu_cxx::__normal_iterator<FaceObject*,std::vector<FaceObject,std::allocator<FaceObject>>>,void>
                ((vector<FaceObject,std::allocator<FaceObject>> *)&faceproposals,
                 (const_iterator)
                 faceproposals.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
                 super__Vector_impl_data._M_finish,
                 (__normal_iterator<FaceObject_*,_std::vector<FaceObject,_std::allocator<FaceObject>_>_>
                  )faceobjects32.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl
                   .super__Vector_impl_data._M_start,
                 (__normal_iterator<FaceObject_*,_std::vector<FaceObject,_std::allocator<FaceObject>_>_>
                  )faceobjects32.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl
                   .super__Vector_impl_data._M_finish);
      std::_Vector_base<FaceObject,_std::allocator<FaceObject>_>::~_Vector_base
                (&faceobjects32.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>);
      if (local_2f8 != (int *)0x0) {
        LOCK();
        *local_2f8 = *local_2f8 + -1;
        UNLOCK();
        if (*local_2f8 == 0) {
          if (local_2e0 == (Allocator *)0x0) {
            free((void *)CONCAT44(label_size.height,label_size.width));
          }
          else {
            (*local_2e0->_vptr_Allocator[3])();
          }
        }
      }
      piVar10 = (int *)CONCAT44(local_348._12_4_,local_348._8_4_);
      if (piVar10 != (int *)0x0) {
        LOCK();
        *piVar10 = *piVar10 + -1;
        UNLOCK();
        if (*piVar10 == 0) {
          if (local_328 == (Allocator *)0x0) {
            free((void *)CONCAT44(local_348._4_4_,local_348._0_4_));
          }
          else {
            (*local_328->_vptr_Allocator[3])();
          }
        }
      }
      piVar10 = (int *)CONCAT44(local_408._12_4_,local_408._8_4_);
      if (piVar10 != (int *)0x0) {
        LOCK();
        *piVar10 = *piVar10 + -1;
        UNLOCK();
        if (*piVar10 == 0) {
          if (local_3e8 == (Allocator *)0x0) {
            free((void *)CONCAT44(local_408._4_4_,local_408._0_4_));
          }
          else {
            (*local_3e8->_vptr_Allocator[3])();
          }
        }
      }
      piVar10 = (int *)CONCAT44(local_488._12_4_,local_488._8_4_);
      if (piVar10 != (int *)0x0) {
        LOCK();
        *piVar10 = *piVar10 + -1;
        UNLOCK();
        if (*piVar10 == 0) {
          if ((Allocator *)local_488._32_8_ == (Allocator *)0x0) {
            free((void *)CONCAT44(local_488._4_4_,local_488._0_4_));
          }
          else {
            (*(*(_func_int ***)local_488._32_8_)[3])();
          }
        }
      }
      piVar10 = (int *)CONCAT44(areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_finish._4_4_,
                                areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_finish._0_4_);
      if (piVar10 != (int *)0x0) {
        LOCK();
        *piVar10 = *piVar10 + -1;
        UNLOCK();
        if (*piVar10 == 0) {
          free(areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start);
        }
      }
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish._0_4_ = 0;
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish._4_4_ = 0;
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      local_448 = 0;
      local_488._0_4_ = 0;
      local_488._4_4_ = 0;
      local_488._8_4_ = 0;
      local_488._12_4_ = 0;
      local_488._16_8_ = (pointer)0x0;
      local_488._24_4_ = 0;
      local_488._32_8_ = (Allocator *)0x0;
      local_488._40_4_ = 0;
      local_488._44_4_ = 0;
      local_488._48_12_ = SUB1612((undefined1  [16])0x0,4);
      ncnn::Extractor::extract(&ex,"510",(Mat *)&areas,0);
      ncnn::Extractor::extract(&ex,"513",(Mat *)local_488,0);
      local_3c8 = 0;
      local_408._0_4_ = 0;
      local_408._4_4_ = 0;
      local_408._8_4_ = 0;
      local_408._12_4_ = 0;
      local_408._16_12_ = SUB1612((undefined1  [16])0x0,4);
      local_3e8 = (Allocator *)0x0;
      iStack_3e0 = 0;
      iStack_3dc = 0;
      auStack_3d8 = SUB1612((undefined1  [16])0x0,4);
      ncnn::Mat::create((Mat *)local_408,1,4,(Allocator *)0x0);
      *(undefined4 *)CONCAT44(local_408._4_4_,local_408._0_4_) = 0x40000000;
      local_308 = 0;
      local_348._0_4_ = 0;
      local_348._4_4_ = 0;
      local_348._8_4_ = 0;
      local_348._12_4_ = 0;
      local_348._16_12_ = SUB1612((undefined1  [16])0x0,4);
      local_328 = (Allocator *)0x0;
      iStack_320 = 0;
      iStack_31c = 0;
      auStack_318 = SUB1612((undefined1  [16])0x0,4);
      ncnn::Mat::create((Mat *)local_348,1,4,(Allocator *)0x0);
      *(undefined4 *)CONCAT44(local_348._4_4_,local_348._0_4_) = 0x40400000;
      generate_anchors((Mat *)&label_size,0x10,(Mat *)local_408,(Mat *)local_348);
      faceobjects32.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      faceobjects32.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      faceobjects32.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      generate_proposals((Mat *)&label_size,0x10,(Mat *)&areas,(Mat *)local_488,0.0,&faceobjects32);
      std::vector<FaceObject,std::allocator<FaceObject>>::
      insert<__gnu_cxx::__normal_iterator<FaceObject*,std::vector<FaceObject,std::allocator<FaceObject>>>,void>
                ((vector<FaceObject,std::allocator<FaceObject>> *)&faceproposals,
                 (const_iterator)
                 faceproposals.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
                 super__Vector_impl_data._M_finish,
                 (__normal_iterator<FaceObject_*,_std::vector<FaceObject,_std::allocator<FaceObject>_>_>
                  )faceobjects32.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl
                   .super__Vector_impl_data._M_start,
                 (__normal_iterator<FaceObject_*,_std::vector<FaceObject,_std::allocator<FaceObject>_>_>
                  )faceobjects32.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl
                   .super__Vector_impl_data._M_finish);
      std::_Vector_base<FaceObject,_std::allocator<FaceObject>_>::~_Vector_base
                (&faceobjects32.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>);
      if (local_2f8 != (int *)0x0) {
        LOCK();
        *local_2f8 = *local_2f8 + -1;
        UNLOCK();
        if (*local_2f8 == 0) {
          if (local_2e0 == (Allocator *)0x0) {
            free((void *)CONCAT44(label_size.height,label_size.width));
          }
          else {
            (*local_2e0->_vptr_Allocator[3])();
          }
        }
      }
      piVar10 = (int *)CONCAT44(local_348._12_4_,local_348._8_4_);
      if (piVar10 != (int *)0x0) {
        LOCK();
        *piVar10 = *piVar10 + -1;
        UNLOCK();
        if (*piVar10 == 0) {
          if (local_328 == (Allocator *)0x0) {
            free((void *)CONCAT44(local_348._4_4_,local_348._0_4_));
          }
          else {
            (*local_328->_vptr_Allocator[3])();
          }
        }
      }
      piVar10 = (int *)CONCAT44(local_408._12_4_,local_408._8_4_);
      if (piVar10 != (int *)0x0) {
        LOCK();
        *piVar10 = *piVar10 + -1;
        UNLOCK();
        if (*piVar10 == 0) {
          if (local_3e8 == (Allocator *)0x0) {
            free((void *)CONCAT44(local_408._4_4_,local_408._0_4_));
          }
          else {
            (*local_3e8->_vptr_Allocator[3])();
          }
        }
      }
      piVar10 = (int *)CONCAT44(local_488._12_4_,local_488._8_4_);
      if (piVar10 != (int *)0x0) {
        LOCK();
        *piVar10 = *piVar10 + -1;
        UNLOCK();
        if (*piVar10 == 0) {
          if ((Allocator *)local_488._32_8_ == (Allocator *)0x0) {
            free((void *)CONCAT44(local_488._4_4_,local_488._0_4_));
          }
          else {
            (*(*(_func_int ***)local_488._32_8_)[3])();
          }
        }
      }
      piVar10 = (int *)CONCAT44(areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_finish._4_4_,
                                areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_finish._0_4_);
      if (piVar10 != (int *)0x0) {
        LOCK();
        *piVar10 = *piVar10 + -1;
        UNLOCK();
        if (*piVar10 == 0) {
          free(areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start);
        }
      }
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish._0_4_ = 0;
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish._4_4_ = 0;
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      local_448 = 0;
      local_488._0_4_ = 0;
      local_488._4_4_ = 0;
      local_488._8_4_ = 0;
      local_488._12_4_ = 0;
      local_488._16_8_ = (pointer)0x0;
      local_488._24_4_ = 0;
      local_488._32_8_ = (Allocator *)0x0;
      local_488._40_4_ = 0;
      local_488._44_4_ = 0;
      local_488._48_12_ = SUB1612((undefined1  [16])0x0,4);
      ncnn::Extractor::extract(&ex,"530",(Mat *)&areas,0);
      ncnn::Extractor::extract(&ex,"533",(Mat *)local_488,0);
      local_3c8 = 0;
      local_408._0_4_ = 0;
      local_408._4_4_ = 0;
      local_408._8_4_ = 0;
      local_408._12_4_ = 0;
      local_408._16_12_ = SUB1612((undefined1  [16])0x0,4);
      local_3e8 = (Allocator *)0x0;
      iStack_3e0 = 0;
      iStack_3dc = 0;
      auStack_3d8 = SUB1612((undefined1  [16])0x0,4);
      ncnn::Mat::create((Mat *)local_408,1,4,(Allocator *)0x0);
      *(undefined4 *)CONCAT44(local_408._4_4_,local_408._0_4_) = 0x40000000;
      local_308 = 0;
      local_348._0_4_ = 0;
      local_348._4_4_ = 0;
      local_348._8_4_ = 0;
      local_348._12_4_ = 0;
      local_348._16_12_ = SUB1612((undefined1  [16])0x0,4);
      local_328 = (Allocator *)0x0;
      iStack_320 = 0;
      iStack_31c = 0;
      auStack_318 = SUB1612((undefined1  [16])0x0,4);
      ncnn::Mat::create((Mat *)local_348,1,4,(Allocator *)0x0);
      *(undefined4 *)CONCAT44(local_348._4_4_,local_348._0_4_) = 0x40400000;
      generate_anchors((Mat *)&label_size,0x20,(Mat *)local_408,(Mat *)local_348);
      faceobjects32.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      faceobjects32.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      faceobjects32.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      generate_proposals((Mat *)&label_size,0x20,(Mat *)&areas,(Mat *)local_488,0.0,&faceobjects32);
      std::vector<FaceObject,std::allocator<FaceObject>>::
      insert<__gnu_cxx::__normal_iterator<FaceObject*,std::vector<FaceObject,std::allocator<FaceObject>>>,void>
                ((vector<FaceObject,std::allocator<FaceObject>> *)&faceproposals,
                 (const_iterator)
                 faceproposals.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
                 super__Vector_impl_data._M_finish,
                 (__normal_iterator<FaceObject_*,_std::vector<FaceObject,_std::allocator<FaceObject>_>_>
                  )faceobjects32.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl
                   .super__Vector_impl_data._M_start,
                 (__normal_iterator<FaceObject_*,_std::vector<FaceObject,_std::allocator<FaceObject>_>_>
                  )faceobjects32.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl
                   .super__Vector_impl_data._M_finish);
      std::_Vector_base<FaceObject,_std::allocator<FaceObject>_>::~_Vector_base
                (&faceobjects32.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>);
      if (local_2f8 != (int *)0x0) {
        LOCK();
        *local_2f8 = *local_2f8 + -1;
        UNLOCK();
        if (*local_2f8 == 0) {
          if (local_2e0 == (Allocator *)0x0) {
            free((void *)CONCAT44(label_size.height,label_size.width));
          }
          else {
            (*local_2e0->_vptr_Allocator[3])();
          }
        }
      }
      piVar10 = (int *)CONCAT44(local_348._12_4_,local_348._8_4_);
      if (piVar10 != (int *)0x0) {
        LOCK();
        *piVar10 = *piVar10 + -1;
        UNLOCK();
        if (*piVar10 == 0) {
          if (local_328 == (Allocator *)0x0) {
            free((void *)CONCAT44(local_348._4_4_,local_348._0_4_));
          }
          else {
            (*local_328->_vptr_Allocator[3])();
          }
        }
      }
      piVar10 = (int *)CONCAT44(local_408._12_4_,local_408._8_4_);
      if (piVar10 != (int *)0x0) {
        LOCK();
        *piVar10 = *piVar10 + -1;
        UNLOCK();
        if (*piVar10 == 0) {
          if (local_3e8 == (Allocator *)0x0) {
            free((void *)CONCAT44(local_408._4_4_,local_408._0_4_));
          }
          else {
            (*local_3e8->_vptr_Allocator[3])();
          }
        }
      }
      piVar10 = (int *)CONCAT44(local_488._12_4_,local_488._8_4_);
      if (piVar10 != (int *)0x0) {
        LOCK();
        *piVar10 = *piVar10 + -1;
        UNLOCK();
        if (*piVar10 == 0) {
          if ((Allocator *)local_488._32_8_ == (Allocator *)0x0) {
            free((void *)CONCAT44(local_488._4_4_,local_488._0_4_));
          }
          else {
            (*(*(_func_int ***)local_488._32_8_)[3])();
          }
        }
      }
      piVar10 = (int *)CONCAT44(areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_finish._4_4_,
                                areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_finish._0_4_);
      if (piVar10 != (int *)0x0) {
        LOCK();
        *piVar10 = *piVar10 + -1;
        UNLOCK();
        if (*piVar10 == 0) {
          free(areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start);
        }
      }
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish._0_4_ = 0;
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish._4_4_ = 0;
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      local_448 = 0;
      local_488._0_4_ = 0;
      local_488._4_4_ = 0;
      local_488._8_4_ = 0;
      local_488._12_4_ = 0;
      local_488._16_8_ = (pointer)0x0;
      local_488._24_4_ = 0;
      local_488._32_8_ = (Allocator *)0x0;
      local_488._40_4_ = 0;
      local_488._44_4_ = 0;
      local_488._48_12_ = SUB1612((undefined1  [16])0x0,4);
      ncnn::Extractor::extract(&ex,"550",(Mat *)&areas,0);
      ncnn::Extractor::extract(&ex,"553",(Mat *)local_488,0);
      local_3c8 = 0;
      local_408._0_4_ = 0;
      local_408._4_4_ = 0;
      local_408._8_4_ = 0;
      local_408._12_4_ = 0;
      local_408._16_12_ = SUB1612((undefined1  [16])0x0,4);
      local_3e8 = (Allocator *)0x0;
      iStack_3e0 = 0;
      iStack_3dc = 0;
      auStack_3d8 = SUB1612((undefined1  [16])0x0,4);
      ncnn::Mat::create((Mat *)local_408,1,4,(Allocator *)0x0);
      *(undefined4 *)CONCAT44(local_408._4_4_,local_408._0_4_) = 0x40000000;
      local_308 = 0;
      local_348._0_4_ = 0;
      local_348._4_4_ = 0;
      local_348._8_4_ = 0;
      local_348._12_4_ = 0;
      local_348._16_12_ = SUB1612((undefined1  [16])0x0,4);
      local_328 = (Allocator *)0x0;
      iStack_320 = 0;
      iStack_31c = 0;
      auStack_318 = SUB1612((undefined1  [16])0x0,4);
      ncnn::Mat::create((Mat *)local_348,1,4,(Allocator *)0x0);
      *(undefined4 *)CONCAT44(local_348._4_4_,local_348._0_4_) = 0x40400000;
      generate_anchors((Mat *)&label_size,0x40,(Mat *)local_408,(Mat *)local_348);
      faceobjects32.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      faceobjects32.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      faceobjects32.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      generate_proposals((Mat *)&label_size,0x40,(Mat *)&areas,(Mat *)local_488,0.0,&faceobjects32);
      std::vector<FaceObject,std::allocator<FaceObject>>::
      insert<__gnu_cxx::__normal_iterator<FaceObject*,std::vector<FaceObject,std::allocator<FaceObject>>>,void>
                ((vector<FaceObject,std::allocator<FaceObject>> *)&faceproposals,
                 (const_iterator)
                 faceproposals.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
                 super__Vector_impl_data._M_finish,
                 (__normal_iterator<FaceObject_*,_std::vector<FaceObject,_std::allocator<FaceObject>_>_>
                  )faceobjects32.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl
                   .super__Vector_impl_data._M_start,
                 (__normal_iterator<FaceObject_*,_std::vector<FaceObject,_std::allocator<FaceObject>_>_>
                  )faceobjects32.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl
                   .super__Vector_impl_data._M_finish);
      std::_Vector_base<FaceObject,_std::allocator<FaceObject>_>::~_Vector_base
                (&faceobjects32.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>);
      if (local_2f8 != (int *)0x0) {
        LOCK();
        *local_2f8 = *local_2f8 + -1;
        UNLOCK();
        if (*local_2f8 == 0) {
          if (local_2e0 == (Allocator *)0x0) {
            free((void *)CONCAT44(label_size.height,label_size.width));
          }
          else {
            (*local_2e0->_vptr_Allocator[3])();
          }
        }
      }
      piVar10 = (int *)CONCAT44(local_348._12_4_,local_348._8_4_);
      if (piVar10 != (int *)0x0) {
        LOCK();
        *piVar10 = *piVar10 + -1;
        UNLOCK();
        if (*piVar10 == 0) {
          if (local_328 == (Allocator *)0x0) {
            free((void *)CONCAT44(local_348._4_4_,local_348._0_4_));
          }
          else {
            (*local_328->_vptr_Allocator[3])();
          }
        }
      }
      piVar10 = (int *)CONCAT44(local_408._12_4_,local_408._8_4_);
      if (piVar10 != (int *)0x0) {
        LOCK();
        *piVar10 = *piVar10 + -1;
        UNLOCK();
        if (*piVar10 == 0) {
          if (local_3e8 == (Allocator *)0x0) {
            free((void *)CONCAT44(local_408._4_4_,local_408._0_4_));
          }
          else {
            (*local_3e8->_vptr_Allocator[3])();
          }
        }
      }
      piVar10 = (int *)CONCAT44(local_488._12_4_,local_488._8_4_);
      if (piVar10 != (int *)0x0) {
        LOCK();
        *piVar10 = *piVar10 + -1;
        UNLOCK();
        if (*piVar10 == 0) {
          if ((Allocator *)local_488._32_8_ == (Allocator *)0x0) {
            free((void *)CONCAT44(local_488._4_4_,local_488._0_4_));
          }
          else {
            (*(*(_func_int ***)local_488._32_8_)[3])();
          }
        }
      }
      piVar10 = (int *)CONCAT44(areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_finish._4_4_,
                                areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_finish._0_4_);
      if (piVar10 != (int *)0x0) {
        LOCK();
        *piVar10 = *piVar10 + -1;
        UNLOCK();
        if (*piVar10 == 0) {
          free(areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start);
        }
      }
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_start = (pointer)0x0;
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish._0_4_ = 0;
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_finish._4_4_ = 0;
      areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
      _M_end_of_storage = (pointer)0x0;
      local_448 = 0;
      local_488._0_4_ = 0;
      local_488._4_4_ = 0;
      local_488._8_4_ = 0;
      local_488._12_4_ = 0;
      local_488._16_8_ = (pointer)0x0;
      local_488._24_4_ = 0;
      local_488._32_8_ = (Allocator *)0x0;
      local_488._40_4_ = 0;
      local_488._44_4_ = 0;
      local_488._48_12_ = SUB1612((undefined1  [16])0x0,4);
      ncnn::Extractor::extract(&ex,"570",(Mat *)&areas,0);
      ncnn::Extractor::extract(&ex,"573",(Mat *)local_488,0);
      local_3c8 = 0;
      local_408._0_4_ = 0;
      local_408._4_4_ = 0;
      local_408._8_4_ = 0;
      local_408._12_4_ = 0;
      local_408._16_12_ = SUB1612((undefined1  [16])0x0,4);
      local_3e8 = (Allocator *)0x0;
      iStack_3e0 = 0;
      iStack_3dc = 0;
      auStack_3d8 = SUB1612((undefined1  [16])0x0,4);
      ncnn::Mat::create((Mat *)local_408,1,4,(Allocator *)0x0);
      *(undefined4 *)CONCAT44(local_408._4_4_,local_408._0_4_) = 0x40000000;
      local_308 = 0;
      local_348._0_4_ = 0;
      local_348._4_4_ = 0;
      local_348._8_4_ = 0;
      local_348._12_4_ = 0;
      local_348._16_12_ = SUB1612((undefined1  [16])0x0,4);
      local_328 = (Allocator *)0x0;
      iStack_320 = 0;
      iStack_31c = 0;
      auStack_318 = SUB1612((undefined1  [16])0x0,4);
      ncnn::Mat::create((Mat *)local_348,1,4,(Allocator *)0x0);
      *(undefined4 *)CONCAT44(local_348._4_4_,local_348._0_4_) = 0x40400000;
      generate_anchors((Mat *)&label_size,0x80,(Mat *)local_408,(Mat *)local_348);
      faceobjects32.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
      super__Vector_impl_data._M_start = (pointer)0x0;
      faceobjects32.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
      super__Vector_impl_data._M_finish = (pointer)0x0;
      faceobjects32.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      generate_proposals((Mat *)&label_size,0x80,(Mat *)&areas,(Mat *)local_488,0.0,&faceobjects32);
      std::vector<FaceObject,std::allocator<FaceObject>>::
      insert<__gnu_cxx::__normal_iterator<FaceObject*,std::vector<FaceObject,std::allocator<FaceObject>>>,void>
                ((vector<FaceObject,std::allocator<FaceObject>> *)&faceproposals,
                 (const_iterator)
                 faceproposals.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
                 super__Vector_impl_data._M_finish,
                 (__normal_iterator<FaceObject_*,_std::vector<FaceObject,_std::allocator<FaceObject>_>_>
                  )faceobjects32.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl
                   .super__Vector_impl_data._M_start,
                 (__normal_iterator<FaceObject_*,_std::vector<FaceObject,_std::allocator<FaceObject>_>_>
                  )faceobjects32.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl
                   .super__Vector_impl_data._M_finish);
      std::_Vector_base<FaceObject,_std::allocator<FaceObject>_>::~_Vector_base
                (&faceobjects32.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>);
      if (local_2f8 != (int *)0x0) {
        LOCK();
        *local_2f8 = *local_2f8 + -1;
        UNLOCK();
        if (*local_2f8 == 0) {
          if (local_2e0 == (Allocator *)0x0) {
            free((void *)CONCAT44(label_size.height,label_size.width));
          }
          else {
            (*local_2e0->_vptr_Allocator[3])();
          }
        }
      }
      piVar10 = (int *)CONCAT44(local_348._12_4_,local_348._8_4_);
      if (piVar10 != (int *)0x0) {
        LOCK();
        *piVar10 = *piVar10 + -1;
        UNLOCK();
        if (*piVar10 == 0) {
          if (local_328 == (Allocator *)0x0) {
            free((void *)CONCAT44(local_348._4_4_,local_348._0_4_));
          }
          else {
            (*local_328->_vptr_Allocator[3])();
          }
        }
      }
      piVar10 = (int *)CONCAT44(local_408._12_4_,local_408._8_4_);
      if (piVar10 != (int *)0x0) {
        LOCK();
        *piVar10 = *piVar10 + -1;
        UNLOCK();
        if (*piVar10 == 0) {
          if (local_3e8 == (Allocator *)0x0) {
            free((void *)CONCAT44(local_408._4_4_,local_408._0_4_));
          }
          else {
            (*local_3e8->_vptr_Allocator[3])();
          }
        }
      }
      piVar10 = (int *)CONCAT44(local_488._12_4_,local_488._8_4_);
      if (piVar10 != (int *)0x0) {
        LOCK();
        *piVar10 = *piVar10 + -1;
        UNLOCK();
        if (*piVar10 == 0) {
          if ((Allocator *)local_488._32_8_ == (Allocator *)0x0) {
            free((void *)CONCAT44(local_488._4_4_,local_488._0_4_));
          }
          else {
            (*(*(_func_int ***)local_488._32_8_)[3])();
          }
        }
      }
      piVar10 = (int *)CONCAT44(areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_finish._4_4_,
                                areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_finish._0_4_);
      if (piVar10 != (int *)0x0) {
        LOCK();
        *piVar10 = *piVar10 + -1;
        UNLOCK();
        if (*piVar10 == 0) {
          free(areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
               super__Vector_impl_data._M_start);
        }
      }
      pFVar16 = faceproposals.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
                super__Vector_impl_data._M_start;
      if (faceproposals.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
          super__Vector_impl_data._M_start !=
          faceproposals.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
          super__Vector_impl_data._M_finish) {
        qsort_descent_inplace
                  (&faceproposals,0,
                   (int)(((long)faceproposals.
                                super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
                                super__Vector_impl_data._M_finish -
                         (long)faceproposals.
                               super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
                               super__Vector_impl_data._M_start) / 0x14) + -1);
        pFVar16 = faceproposals.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
                  super__Vector_impl_data._M_finish;
      }
      local_488._0_4_ = 0;
      local_488._4_4_ = 0;
      local_488._8_4_ = 0;
      local_488._12_4_ = 0;
      local_488._16_8_ = (pointer)0x0;
      uVar17 = ((long)pFVar16 -
               (long)faceproposals.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>.
                     _M_impl.super__Vector_impl_data._M_start) / 0x14;
      iVar14 = (int)uVar17;
      std::vector<float,_std::allocator<float>_>::vector
                (&areas,(long)iVar14,(allocator_type *)local_408);
      uVar19 = 0;
      uVar20 = 0;
      if (0 < iVar14) {
        uVar20 = uVar17 & 0xffffffff;
      }
      pfVar18 = &((faceproposals.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl
                   .super__Vector_impl_data._M_start)->rect).height;
      for (; uVar20 != uVar19; uVar19 = uVar19 + 1) {
        areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start[uVar19] = pfVar18[-1] * *pfVar18;
        pfVar18 = pfVar18 + 5;
      }
      for (local_408._0_4_ = 0; (int)local_408._0_4_ < iVar14; local_408._0_4_ = local_408._0_4_ + 1
          ) {
        pFVar16 = faceproposals.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
                  super__Vector_impl_data._M_start + (int)local_408._0_4_;
        uVar19 = (ulong)(CONCAT44(local_488._12_4_,local_488._8_4_) -
                        CONCAT44(local_488._4_4_,local_488._0_4_)) >> 2;
        uVar17 = uVar19 & 0xffffffff;
        if ((int)uVar19 < 1) {
          uVar17 = 0;
        }
        uVar19 = 1;
        for (uVar20 = 0; uVar17 != uVar20; uVar20 = uVar20 + 1) {
          iVar15 = *(int *)(CONCAT44(local_488._4_4_,local_488._0_4_) + uVar20 * 4);
          uVar3._0_4_ = (pFVar16->rect).x;
          uVar3._4_4_ = (pFVar16->rect).y;
          auVar31._8_8_ = 0;
          auVar31._0_8_ = uVar3;
          uVar1 = (pFVar16->rect).width;
          uVar7 = (pFVar16->rect).height;
          uVar4._0_4_ = faceproposals.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>.
                        _M_impl.super__Vector_impl_data._M_start[iVar15].rect.x;
          uVar4._4_4_ = faceproposals.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>.
                        _M_impl.super__Vector_impl_data._M_start[iVar15].rect.y;
          auVar30._8_8_ = 0;
          auVar30._0_8_ = uVar4;
          uVar2 = faceproposals.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
                  super__Vector_impl_data._M_start[iVar15].rect.width;
          uVar8 = faceproposals.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
                  super__Vector_impl_data._M_start[iVar15].rect.height;
          auVar25._0_4_ = (float)uVar2 + (float)(undefined4)uVar4;
          auVar25._4_4_ = (float)uVar8 + (float)uVar4._4_4_;
          auVar25._8_8_ = 0;
          auVar31 = maxps(auVar30,auVar31);
          auVar29._0_4_ = (float)uVar1 + (float)(undefined4)uVar3;
          auVar29._4_4_ = (float)uVar7 + (float)uVar3._4_4_;
          auVar29._8_8_ = 0;
          auVar25 = minps(auVar25,auVar29);
          fVar23 = auVar25._0_4_ - auVar31._0_4_;
          fVar27 = auVar25._4_4_ - auVar31._4_4_;
          fVar24 = 0.0;
          if (0.0 < fVar27 && 0.0 < fVar23) {
            fVar24 = fVar23 * fVar27;
          }
          if (0.45 < fVar24 / ((areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                                super__Vector_impl_data._M_start[(int)local_408._0_4_] +
                               areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.
                               super__Vector_impl_data._M_start[iVar15]) - fVar24)) {
            uVar19 = 0;
          }
        }
        if ((int)uVar19 != 0) {
          std::vector<int,_std::allocator<int>_>::push_back
                    ((vector<int,_std::allocator<int>_> *)local_488,
                     (value_type_conflict1 *)local_408);
        }
      }
      std::_Vector_base<float,_std::allocator<float>_>::~_Vector_base
                (&areas.super__Vector_base<float,_std::allocator<float>_>);
      uVar17 = (ulong)(CONCAT44(local_488._12_4_,local_488._8_4_) -
                      CONCAT44(local_488._4_4_,local_488._0_4_)) >> 2;
      iVar14 = (int)uVar17;
      std::vector<FaceObject,_std::allocator<FaceObject>_>::resize(&faceobjects,(long)iVar14);
      fVar23 = (float)(int)local_228;
      local_228 = (float)(int)fStack_224 + -1.0;
      fStack_224 = fVar23 + -1.0;
      fStack_220 = (float)(int)fStack_220 + 0.0;
      fStack_21c = (float)(int)fStack_21c + 0.0;
      uVar19 = 0;
      uVar17 = uVar17 & 0xffffffff;
      if (iVar14 < 1) {
        uVar17 = uVar19;
      }
      local_2a8._0_4_ = local_2a8._4_4_;
      fStack_2a0 = (float)local_2a8._4_4_;
      fStack_29c = (float)local_2a8._4_4_;
      lVar21 = 8;
      for (; uVar17 != uVar19; uVar19 = uVar19 + 1) {
        FaceObject::operator=
                  ((FaceObject *)
                   ((long)faceobjects.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>.
                          _M_impl.super__Vector_impl_data._M_start + lVar21 + -8),
                   faceproposals.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl
                   .super__Vector_impl_data._M_start +
                   *(int *)(CONCAT44(local_488._4_4_,local_488._0_4_) + uVar19 * 4));
        uVar5 = *(undefined8 *)
                 ((long)faceobjects.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>.
                        _M_impl.super__Vector_impl_data._M_start + lVar21 + -8);
        uVar6 = *(undefined8 *)
                 ((long)&((faceobjects.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>.
                           _M_impl.super__Vector_impl_data._M_start)->rect).x + lVar21);
        fVar23 = (float)uVar5;
        fVar24 = (float)((ulong)uVar5 >> 0x20);
        auVar26._0_4_ = fVar23 - (float)iVar22;
        auVar26._4_4_ = fVar24 - (float)top;
        auVar26._8_8_ = 0;
        auVar25 = divps(auVar26,_local_2a8);
        auVar28._0_4_ = ((float)uVar6 + fVar23) - (float)iVar22;
        auVar28._4_4_ = ((float)((ulong)uVar6 >> 0x20) + fVar24) - (float)top;
        auVar28._8_8_ = 0;
        auVar31 = divps(auVar28,_local_2a8);
        auVar11._4_4_ = fStack_224;
        auVar11._0_4_ = local_228;
        auVar11._8_4_ = fStack_220;
        auVar11._12_4_ = fStack_21c;
        auVar25 = minps(auVar11,auVar25);
        auVar25 = maxps(ZEXT816(0),auVar25);
        auVar31 = minps(auVar11,auVar31);
        auVar31 = maxps(ZEXT816(0),auVar31);
        *(long *)((long)faceobjects.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>.
                        _M_impl.super__Vector_impl_data._M_start + lVar21 + -8) = auVar25._0_8_;
        *(ulong *)((long)&((faceobjects.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>.
                            _M_impl.super__Vector_impl_data._M_start)->rect).x + lVar21) =
             CONCAT44(auVar31._4_4_ - auVar25._4_4_,auVar31._0_4_ - auVar25._0_4_);
        lVar21 = lVar21 + 0x14;
      }
      std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
                ((_Vector_base<int,_std::allocator<int>_> *)local_488);
      std::_Vector_base<FaceObject,_std::allocator<FaceObject>_>::~_Vector_base
                (&faceproposals.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>);
      ncnn::Extractor::~Extractor(&ex);
      piVar10 = (int *)CONCAT44(local_278._12_4_,local_278._8_4_);
      if (piVar10 != (int *)0x0) {
        LOCK();
        *piVar10 = *piVar10 + -1;
        UNLOCK();
        if (*piVar10 == 0) {
          if ((Allocator *)local_278._32_8_ == (Allocator *)0x0) {
            free((void *)CONCAT44(local_278._4_4_,local_278._0_4_));
          }
          else {
            (*(*(_func_int ***)local_278._32_8_)[3])();
          }
        }
      }
      piVar10 = (int *)CONCAT44(iStack_20c,local_210);
      if (piVar10 != (int *)0x0) {
        LOCK();
        *piVar10 = *piVar10 + -1;
        UNLOCK();
        if (*piVar10 == 0) {
          if (local_1f8 == (Allocator *)0x0) {
            free(_image);
          }
          else {
            (*local_1f8->_vptr_Allocator[3])();
          }
        }
      }
      ncnn::Net::~Net(&scrfd);
      cv::Mat::clone();
      lVar21 = 0;
      uVar17 = 0;
      while( true ) {
        pFVar16 = faceobjects.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
                  super__Vector_impl_data._M_start;
        local_278._8_8_ = &image;
        if ((ulong)(((long)faceobjects.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>.
                           _M_impl.super__Vector_impl_data._M_finish -
                    (long)faceobjects.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>.
                          _M_impl.super__Vector_impl_data._M_start) / 0x14) <= uVar17) break;
        fprintf(_stderr,"%.5f at %.2f %.2f %.2f x %.2f\n",
                (double)*(float *)((long)&(faceobjects.
                                           super__Vector_base<FaceObject,_std::allocator<FaceObject>_>
                                           ._M_impl.super__Vector_impl_data._M_start)->prob + lVar21
                                  ),
                (double)*(float *)((long)&((faceobjects.
                                            super__Vector_base<FaceObject,_std::allocator<FaceObject>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->rect).x +
                                  lVar21),
                (double)*(float *)((long)&((faceobjects.
                                            super__Vector_base<FaceObject,_std::allocator<FaceObject>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->rect).y +
                                  lVar21),
                (double)*(float *)((long)&((faceobjects.
                                            super__Vector_base<FaceObject,_std::allocator<FaceObject>_>
                                            ._M_impl.super__Vector_impl_data._M_start)->rect).width
                                  + lVar21),
                SUB84((double)*(float *)((long)&((faceobjects.
                                                  super__Vector_base<FaceObject,_std::allocator<FaceObject>_>
                                                  ._M_impl.super__Vector_impl_data._M_start)->rect).
                                                height + lVar21),0),
                ((long)faceobjects.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                (long)faceobjects.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>.
                      _M_impl.super__Vector_impl_data._M_start) % 0x14);
        local_278._16_4_ = 0;
        local_278._20_4_ = 0;
        local_278._0_4_ = 0x3010000;
        pfVar18 = (float *)((long)&(pFVar16->rect).x + lVar21);
        local_408._0_4_ = (undefined4)ROUND(*pfVar18);
        local_408._4_4_ = (undefined4)ROUND(pfVar18[1]);
        local_408._8_4_ = (undefined4)ROUND(pfVar18[2]);
        local_408._12_4_ = (undefined4)ROUND(pfVar18[3]);
        cv::Matx<double,_4,_1>::Matx((Matx<double,_4,_1> *)&scrfd);
        scrfd._vptr_Net = (_func_int **)0x0;
        scrfd.opt.lightmode = false;
        scrfd.opt._1_3_ = 0;
        scrfd.opt.num_threads = 0x406fe000;
        scrfd.opt.blob_allocator = (Allocator *)0x0;
        scrfd.opt.workspace_allocator = (Allocator *)0x0;
        cv::rectangle((string *)local_278,local_408,&scrfd,1,8,0);
        sprintf((char *)&scrfd,"%.1f%%",(double)(*(float *)((long)&pFVar16->prob + lVar21) * 100.0))
        ;
        auVar12._12_4_ = 0;
        auVar12._0_12_ =
             (undefined1  [12])
             faceobjects32.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
             super__Vector_impl_data._4_12_;
        faceobjects32.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
        super__Vector_impl_data._0_16_ = auVar12 << 0x20;
        std::__cxx11::string::string((string *)local_278,(char *)&scrfd,(allocator *)local_488);
        cv::getTextSize((string *)&label_size,(int)(string *)local_278,0.5,0,(int *)0x1);
        std::__cxx11::string::~string((string *)local_278);
        iVar15 = (int)*(float *)((long)&(pFVar16->rect).x + lVar21);
        iVar14 = (int)((*(float *)((long)&(pFVar16->rect).y + lVar21) - (float)label_size.height) -
                      (float)(int)faceobjects32.
                                  super__Vector_base<FaceObject,_std::allocator<FaceObject>_>.
                                  _M_impl.super__Vector_impl_data._M_start);
        if (iVar14 < 1) {
          iVar14 = 0;
        }
        iVar22 = iStack_20c - label_size.width;
        if (label_size.width + iVar15 <= iStack_20c) {
          iVar22 = iVar15;
        }
        local_488._16_8_ = (pointer)0x0;
        local_488._0_4_ = 0x3010000;
        local_348._12_4_ =
             (int)faceobjects32.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
                  super__Vector_impl_data._M_start + label_size.height;
        local_348._8_4_ = label_size.width;
        local_348._0_4_ = iVar22;
        local_348._4_4_ = iVar14;
        local_488._8_8_ = &image;
        cv::Matx<double,_4,_1>::Matx((Matx<double,_4,_1> *)local_278);
        local_278._0_4_ = 0;
        local_278._4_4_ = 0x406fe000;
        local_278._8_4_ = 0;
        local_278._12_4_ = 0x406fe000;
        local_278._16_4_ = 0;
        local_278._20_4_ = 0x406fe000;
        local_278._24_4_ = 0;
        local_278._28_4_ = 0;
        cv::rectangle(local_488,local_348,(string *)local_278,0xffffffffffffffff,8,0);
        local_488._16_8_ = (pointer)0x0;
        local_488._0_4_ = 0x3010000;
        local_488._8_8_ = &image;
        std::__cxx11::string::string((string *)local_278,(char *)&scrfd,(allocator *)&ex);
        faceproposals.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
        super__Vector_impl_data._M_start._4_4_ = iVar14 + label_size.height;
        faceproposals.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>._M_impl.
        super__Vector_impl_data._M_start._0_4_ = iVar22;
        cv::Matx<double,_4,_1>::Matx((Matx<double,_4,_1> *)&areas);
        areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_end_of_storage = (pointer)0x0;
        areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_start = (pointer)0x0;
        areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish._0_4_ = 0;
        areas.super__Vector_base<float,_std::allocator<float>_>._M_impl.super__Vector_impl_data.
        _M_finish._4_4_ = 0;
        cv::putText(0x3fe0000000000000,local_488,(string *)local_278,&faceproposals,0,
                    (Matx<double,_4,_1> *)&areas,1,8,0);
        std::__cxx11::string::~string((string *)local_278);
        uVar17 = uVar17 + 1;
        lVar21 = lVar21 + 0x14;
      }
      std::__cxx11::string::string((string *)&scrfd,"image",(allocator *)local_488);
      local_278._16_4_ = 0;
      local_278._20_4_ = 0;
      local_278._0_4_ = 0x1010000;
      cv::imshow((string *)&scrfd,(_InputArray *)local_278);
      std::__cxx11::string::~string((string *)&scrfd);
      iVar14 = 0;
      cv::waitKey(0);
      cv::Mat::~Mat(&image);
      std::_Vector_base<FaceObject,_std::allocator<FaceObject>_>::~_Vector_base
                (&faceobjects.super__Vector_base<FaceObject,_std::allocator<FaceObject>_>);
    }
    else {
      fprintf(_stderr,"cv::imread %s failed\n",pcVar9);
      iVar14 = -1;
    }
    cv::Mat::~Mat(&m);
  }
  else {
    fprintf(_stderr,"Usage: %s [imagepath]\n",*argv);
    iVar14 = -1;
  }
  return iVar14;
}

Assistant:

int main(int argc, char** argv)
{
    if (argc != 2)
    {
        fprintf(stderr, "Usage: %s [imagepath]\n", argv[0]);
        return -1;
    }

    const char* imagepath = argv[1];

    cv::Mat m = cv::imread(imagepath, 1);
    if (m.empty())
    {
        fprintf(stderr, "cv::imread %s failed\n", imagepath);
        return -1;
    }

    std::vector<FaceObject> faceobjects;
    detect_scrfd(m, faceobjects);

    draw_faceobjects(m, faceobjects);

    return 0;
}